

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O3

void __thiscall
vkt::anon_unknown_0::ShaderCase::initPrograms(ShaderCase *this,SourceCollections *sourceCollection)

{
  ValueBlock *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ProgramSources *src;
  size_t progNdx;
  DataType DVar5;
  int iVar6;
  DataType DVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  char *pcVar11;
  ProgramSources *pPVar12;
  InternalError *this_00;
  ShaderCaseSpecification *pSVar13;
  pointer pPVar14;
  ValueBlock *valueBlock;
  long lVar15;
  ValueBlock *valueBlock_00;
  pointer pVVar16;
  ulong uVar17;
  pointer pPVar18;
  pointer pPVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  StringTemplate tmpl;
  vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> specializedSources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream decl;
  ostringstream setup;
  ostringstream output;
  undefined1 auStack_618 [8];
  ShaderCase *local_610;
  ulong local_608;
  pointer local_600;
  ShaderCaseSpecification *local_5f8;
  ValueBlock *local_5f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  string local_5a8;
  pointer local_588;
  undefined1 local_580 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  pointer local_558;
  vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_> local_550;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_538;
  uint local_508;
  value_type local_500;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [360];
  SourceCollections *local_368;
  string local_360;
  size_type *local_340;
  long local_338;
  size_type local_330 [2];
  long local_320 [14];
  ios_base local_2b0 [264];
  uint local_1a8 [2];
  value_type local_1a0 [3];
  ios_base local_138 [264];
  
  local_368 = sourceCollection;
  std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::vector
            (&local_550,
             ((long)(this->m_spec).programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_spec).programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111,
             (allocator_type *)local_4e0);
  if ((this->m_spec).expectResult != EXPECT_PASS) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Only EXPECT_PASS is supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktShaderLibrary.cpp"
               ,0x6be);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  local_5f8 = &this->m_spec;
  local_610 = this;
  if (local_5f8->caseType == CASETYPE_VERTEX_ONLY) {
    local_558 = local_550.
                super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_5f0 = *(ValueBlock **)
                 &(((this->m_spec).programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_Position = dEQP_Position;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"layout(location = 0) in highp vec4 dEQP_Position;\n",0x32);
    pVVar16 = (local_610->m_spec).values.inputs.
              super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((local_610->m_spec).values.inputs.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar16) {
      local_600 = (pointer)CONCAT44(local_600._4_4_,1);
      lVar20 = 0x20;
      pSVar13 = (ShaderCaseSpecification *)0x0;
      do {
        DVar7 = *(DataType *)((long)pVVar16 + lVar20 + -0x18);
        local_5f8 = pSVar13;
        pcVar8 = glu::getDataTypeName(DVar7);
        DVar5 = getTransportType(DVar7);
        pcVar11 = glu::getDataTypeName(DVar5);
        local_608 = CONCAT44(local_608._4_4_,1);
        if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
          iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
          local_608 = CONCAT44(local_608._4_4_,iVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4e0,"layout(location = ",0x12);
        poVar10 = (ostream *)std::ostream::operator<<(local_4e0,(int)local_600);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") in ",5);
        if (DVar7 == DVar5) {
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_618 +
                            (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                    *)(local_4e0._0_8_ + -0x18))->
                                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x138);
          }
          else {
            sVar9 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar11,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          lVar15 = 2;
          pcVar8 = ";\n";
        }
        else {
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_618 +
                            (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                    *)(local_4e0._0_8_ + -0x18))->
                                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x138);
          }
          else {
            sVar9 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar11,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0," a_",3);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2f8);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar8,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(a_",3);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          lVar15 = 3;
          pcVar8 = ");\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,lVar15);
        local_600 = (pointer)CONCAT44(local_600._4_4_,(int)local_600 + (int)local_608);
        pSVar13 = (ShaderCaseSpecification *)((long)&local_5f8->caseType + 1);
        pVVar16 = (local_610->m_spec).values.inputs.
                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x50;
      } while (pSVar13 < (ShaderCaseSpecification *)
                         (((long)(local_610->m_spec).values.inputs.
                                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >> 4) *
                         -0x3333333333333333));
    }
    local_588 = (pointer)&(local_610->m_spec).values;
    declareUniforms((ostringstream *)local_4e0,(ValueBlock *)local_588);
    pVVar16 = (local_610->m_spec).values.outputs.
              super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((local_610->m_spec).values.outputs.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar16) {
      local_608 = 0;
      lVar20 = 0x20;
      pSVar13 = (ShaderCaseSpecification *)0x0;
      do {
        DVar7 = *(DataType *)((long)pVVar16 + lVar20 + -0x18);
        local_5f8 = pSVar13;
        pcVar8 = glu::getDataTypeName(DVar7);
        DVar5 = getTransportType(DVar7);
        pcVar11 = glu::getDataTypeName(DVar5);
        local_600 = (pointer)CONCAT44(local_600._4_4_,1);
        if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
          iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
          local_600 = (pointer)CONCAT44(local_600._4_4_,iVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4e0,"layout(location = ",0x12);
        poVar10 = (ostream *)std::ostream::operator<<(local_4e0,(int)local_608);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") flat out ",0xb);
        if (DVar7 == DVar5) {
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_618 +
                            (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                    *)(local_4e0._0_8_ + -0x18))->
                                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x138);
          }
          else {
            sVar9 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar11,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          lVar15 = 2;
          pcVar8 = ";\n";
        }
        else {
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_618 +
                            (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                    *)(local_4e0._0_8_ + -0x18))->
                                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x138);
          }
          else {
            sVar9 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar11,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0," v_",3);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)auStack_618 +
                            (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                    *)(local_4e0._0_8_ + -0x18))->
                                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x138);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar8,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"v_",2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar9 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar11,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          lVar15 = 3;
          pcVar8 = ");\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,lVar15);
        local_608 = (ulong)(uint)((int)local_608 + (int)local_600);
        pSVar13 = (ShaderCaseSpecification *)((long)&local_5f8->caseType + 1);
        pVVar16 = (local_610->m_spec).values.outputs.
                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x50;
      } while (pSVar13 < (ShaderCaseSpecification *)
                         (((long)(local_610->m_spec).values.outputs.
                                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >> 4) *
                         -0x3333333333333333));
    }
    local_538._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_538._M_impl.super__Rb_tree_header._M_header;
    local_538._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_538._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_538._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_538._M_impl.super__Rb_tree_header._M_header._M_right =
         local_538._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_5e8,(char (*) [13])0xac45be,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_538,&local_5e8);
    paVar2 = &local_5e8.second.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_5e8.second._M_dataplus._M_p,
                      local_5e8.second.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_5e8.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_580._4_4_,local_580._0_4_) != &local_570) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_580._4_4_,local_580._0_4_),
                      local_570._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_5e8,(char (*) [6])0xac4407,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_538,&local_5e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_5e8.second._M_dataplus._M_p,
                      local_5e8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_580._4_4_,local_580._0_4_) != &local_570) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_580._4_4_,local_580._0_4_),
                      local_570._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_5e8,(char (*) [7])0xb87dd3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_538,&local_5e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_5e8.second._M_dataplus._M_p,
                      local_5e8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_580._4_4_,local_580._0_4_) != &local_570) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_580._4_4_,local_580._0_4_),
                      local_570._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[20],_const_char_(&)[12],_true>
              (&local_5e8,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [12])0xb46ad7);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_538,&local_5e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_5e8.second._M_dataplus._M_p,
                      local_5e8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_5e8,(string *)local_5f0);
    tcu::StringTemplate::specialize
              ((string *)local_580,(StringTemplate *)&local_5e8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_538);
    glu::sl::injectExtensionRequirements
              (&local_5a8,(string *)local_580,
               &((local_610->m_spec).programs.
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions,SHADERTYPE_VERTEX);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_580._4_4_,local_580._0_4_) != &local_570) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_580._4_4_,local_580._0_4_),
                      local_570._M_allocated_capacity + 1);
    }
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_5e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_538);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
    std::ios_base::~ios_base((ios_base *)(local_4d0 + 0x60));
    local_508 = 0;
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_500,local_5a8._M_dataplus._M_p,
               local_5a8._M_dataplus._M_p + local_5a8._M_string_length);
    pPVar14 = local_558;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)local_558->sources +
                   local_508),&local_500);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    pcVar8 = glu::getGLSLVersionDeclaration((local_610->m_spec).targetVersion);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)auStack_618 +
                      (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                              *)(local_4e0._0_8_ + -0x18))->
                           super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                           )._M_impl.super__Vector_impl_data._M_start + 0x138);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"precision highp float;\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"precision highp int;\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
    glu::sl::genCompareFunctions((ostringstream *)local_4e0,(ValueBlock *)local_588,false);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
    pVVar16 = (local_610->m_spec).values.outputs.
              super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((local_610->m_spec).values.outputs.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar16) {
      local_608 = 0;
      lVar20 = 0x20;
      pPVar19 = (pointer)0x0;
      do {
        DVar7 = *(DataType *)((long)pVVar16 + lVar20 + -0x18);
        local_600 = pPVar19;
        local_5f0 = (ValueBlock *)glu::getDataTypeName(DVar7);
        DVar5 = getTransportType(DVar7);
        pcVar8 = glu::getDataTypeName(DVar5);
        local_5f8 = (ShaderCaseSpecification *)CONCAT44(local_5f8._4_4_,1);
        if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
          iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
          local_5f8 = (ShaderCaseSpecification *)CONCAT44(local_5f8._4_4_,iVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4e0,"layout(location = ",0x12);
        poVar10 = (ostream *)std::ostream::operator<<(local_4e0,(int)local_608);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") flat in ",10);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
        }
        pPVar14 = local_600;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        pcVar8 = "v_";
        if (DVar7 == DVar5) {
          pcVar8 = "";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,pcVar8,(ulong)((uint)(DVar7 != DVar5) * 2));
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,*(char **)((long)pVVar16 + lVar20 + -8),
                             *(long *)((long)&(pVVar16->type).m_type + lVar20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        if (DVar7 != DVar5) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t",1);
          pVVar1 = local_5f0;
          if (local_5f0 == (ValueBlock *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2f8);
          }
          else {
            sVar9 = strlen((char *)local_5f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,(char *)pVVar1,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          pVVar1 = local_5f0;
          if (local_5f0 == (ValueBlock *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar9 = strlen((char *)local_5f0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)pVVar1,sVar9);
          }
          pPVar14 = local_600;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(v_",3);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
        }
        local_608 = (ulong)(uint)((int)local_608 + (int)local_5f8);
        pPVar19 = (pointer)((long)&(((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                    pPVar14->sources)->
                                   super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
        pVVar16 = (local_610->m_spec).values.outputs.
                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar14 = (pointer)0xcccccccccccccccd;
        lVar20 = lVar20 + 0x50;
      } while (pPVar19 < (pointer)(((long)(local_610->m_spec).values.outputs.
                                          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16
                                   >> 4) * -0x3333333333333333));
    }
    declareReferenceBlock((ostringstream *)local_4e0,(ValueBlock *)local_588);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"{\n",2);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,local_5e8.first._M_dataplus._M_p,
               local_5e8.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != &local_5e8.first.field_2) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\t",1);
    genCompareOp((ostringstream *)local_4e0,(char *)local_588,valueBlock_00,(char *)pPVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
    std::ios_base::~ios_base((ios_base *)(local_4d0 + 0x60));
    local_1a8[0] = 1;
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,local_538._M_impl._0_8_,
               (undefined1 *)
               (local_538._M_impl._0_8_ +
               CONCAT44(local_538._M_impl.super__Rb_tree_header._M_header._4_4_,
                        local_538._M_impl.super__Rb_tree_header._M_header._M_color)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)local_558->sources +
                   local_1a8[0]),local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
      operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Base_ptr *)local_538._M_impl._0_8_ !=
        &local_538._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_538._M_impl._0_8_,
                      (ulong)((long)&(local_538._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p == &local_5a8.field_2) goto LAB_003aa7f6;
  }
  else {
    if (local_5f8->caseType != CASETYPE_FRAGMENT_ONLY) {
      pPVar18 = (this->m_spec).programs.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_spec).programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish != pPVar18) {
        lVar20 = 0xd0;
        uVar17 = 0;
        uVar21 = 0;
        do {
          local_4e0._0_8_ = local_5f8;
          std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
          vector((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
                 (local_4e0 + 8),
                 (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
                 ((long)&(pPVar18->sources).sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar20));
          local_4d0._16_4_ = 4;
          local_600 = local_550.
                      super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pPVar12 = (ProgramSources *)
                    ((long)&(((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                             (local_550.
                              super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                              ._M_impl.super__Vector_impl_data._M_start)->sources)->
                            super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar17);
          pPVar18 = (local_610->m_spec).programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          src = (ProgramSources *)((long)pPVar18 + lVar20 + -0xd0);
          local_608 = uVar17;
          specializeShaderSources
                    (pPVar12,src,(ProgramSpecializationParams *)local_4e0,SHADERTYPE_VERTEX,
                     vkt::(anonymous_namespace)::generateVertexSpecialization_abi_cxx11_);
          specializeShaderSources
                    (pPVar12,src,(ProgramSpecializationParams *)local_4e0,SHADERTYPE_FRAGMENT,
                     vkt::(anonymous_namespace)::generateFragmentSpecialization_abi_cxx11_);
          specializeShaderSources
                    (pPVar12,src,(ProgramSpecializationParams *)local_4e0,SHADERTYPE_GEOMETRY,
                     vkt::(anonymous_namespace)::generateGeometrySpecialization_abi_cxx11_);
          specializeShaderSources
                    (pPVar12,src,(ProgramSpecializationParams *)local_4e0,
                     SHADERTYPE_TESSELLATION_CONTROL,
                     vkt::(anonymous_namespace)::generateTessControlSpecialization_abi_cxx11_);
          specializeShaderSources
                    (pPVar12,src,(ProgramSpecializationParams *)local_4e0,
                     SHADERTYPE_TESSELLATION_EVALUATION,
                     vkt::(anonymous_namespace)::generateTessEvalSpecialization_abi_cxx11_);
          uVar17 = local_608;
          (&local_600->separable)[local_608] =
               *(bool *)((long)(pPVar18->sources).sources + lVar20 + -8);
          std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
          ~vector((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *
                  )(local_4e0 + 8));
          uVar21 = uVar21 + 1;
          pPVar18 = (local_610->m_spec).programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = uVar17 + 0xd0;
          lVar20 = lVar20 + 0xf0;
        } while (uVar21 < (ulong)(((long)(local_610->m_spec).programs.
                                         super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar18
                                  >> 4) * -0x1111111111111111));
      }
      goto LAB_003aa7f6;
    }
    local_588 = local_550.
                super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
                _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
    pcVar8 = glu::getGLSLVersionDeclaration((local_610->m_spec).targetVersion);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)auStack_618 +
                      (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                              *)(local_4e0._0_8_ + -0x18))->
                           super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                           )._M_impl.super__Vector_impl_data._M_start + 0x138);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"precision highp float;\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"precision highp int;\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"layout(location = 0) in highp vec4 dEQP_Position;\n",0x32);
    pVVar16 = (local_610->m_spec).values.inputs.
              super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((local_610->m_spec).values.inputs.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar16) {
      local_608 = 0;
      local_5f8 = (ShaderCaseSpecification *)CONCAT44(local_5f8._4_4_,1);
      lVar20 = 0x20;
      uVar17 = 0;
      do {
        DVar7 = *(DataType *)((long)pVVar16 + lVar20 + -0x18);
        DVar5 = getTransportType(DVar7);
        local_5f0 = (ValueBlock *)CONCAT44(local_5f0._4_4_,DVar5);
        pcVar8 = glu::getDataTypeName(DVar5);
        local_600 = (pointer)CONCAT44(local_600._4_4_,1);
        if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
          iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
          local_600 = (pointer)CONCAT44(local_600._4_4_,iVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4e0,"layout(location = ",0x12);
        poVar10 = (ostream *)std::ostream::operator<<(local_4e0,(int)local_5f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") in ",5);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," a_",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,*(char **)((long)pVVar16 + lVar20 + -8),
                             *(long *)((long)&(pVVar16->type).m_type + lVar20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4e0,"layout(location = ",0x12);
        poVar10 = (ostream *)std::ostream::operator<<(local_4e0,(int)local_608);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") flat out ",0xb);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        pcVar8 = "v_";
        if ((DataType)local_5f0 == DVar7) {
          pcVar8 = "";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,pcVar8,(ulong)((uint)((DataType)local_5f0 != DVar7) * 2));
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,*(char **)((long)pVVar16 + lVar20 + -8),
                             *(long *)((long)&(pVVar16->type).m_type + lVar20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        local_5f8 = (ShaderCaseSpecification *)
                    CONCAT44(local_5f8._4_4_,(int)local_5f8 + (int)local_600);
        local_608 = (ulong)(uint)((int)local_608 + (int)local_600);
        uVar17 = uVar17 + 1;
        pVVar16 = (local_610->m_spec).values.inputs.
                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x50;
      } while (uVar17 < (ulong)(((long)(local_610->m_spec).values.inputs.
                                       super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >>
                                4) * -0x3333333333333333));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"\tgl_Position = dEQP_Position;\n",0x1e);
    pVVar16 = (local_610->m_spec).values.inputs.
              super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((local_610->m_spec).values.inputs.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar16) {
      lVar20 = 0x20;
      uVar17 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"\t",1);
        DVar7 = getTransportType(*(DataType *)((long)pVVar16 + lVar20 + -0x18));
        bVar22 = DVar7 != *(DataType *)((long)pVVar16 + lVar20 + -0x18);
        pcVar8 = "v_";
        if (!bVar22) {
          pcVar8 = "";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4e0,pcVar8,(ulong)((uint)bVar22 * 2));
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                             *(long *)((long)&(pVVar16->type).m_type + lVar20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = a_",5);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,*(char **)((long)pVVar16 + lVar20 + -8),
                             *(long *)((long)&(pVVar16->type).m_type + lVar20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        uVar17 = uVar17 + 1;
        pVVar16 = (local_610->m_spec).values.inputs.
                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x50;
      } while (uVar17 < (ulong)(((long)(local_610->m_spec).values.inputs.
                                       super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >>
                                4) * -0x3333333333333333));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
    std::ios_base::~ios_base((ios_base *)(local_4d0 + 0x60));
    local_508 = 0;
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_500,local_340,(long)local_340 + local_338);
    pPVar14 = local_588;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)local_588->sources +
                   local_508),&local_500);
    local_558 = *(pointer *)
                 &(((local_610->m_spec).programs.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_start)->sources).sources[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pVVar1 = &(local_610->m_spec).values;
    glu::sl::genCompareFunctions((ostringstream *)local_4e0,pVVar1,false);
    genCompareOp((ostringstream *)local_1a8,(char *)pVVar1,valueBlock,(char *)pPVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e0,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
    pVVar16 = (local_610->m_spec).values.inputs.
              super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_5f0 = pVVar1;
    if ((local_610->m_spec).values.inputs.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar16) {
      local_608 = 0;
      lVar20 = 0x20;
      pSVar13 = (ShaderCaseSpecification *)0x0;
      do {
        DVar7 = *(DataType *)((long)pVVar16 + lVar20 + -0x18);
        local_5f8 = pSVar13;
        pcVar8 = glu::getDataTypeName(DVar7);
        DVar5 = getTransportType(DVar7);
        pcVar11 = glu::getDataTypeName(DVar5);
        local_600 = (pointer)CONCAT44(local_600._4_4_,1);
        if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
          iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
          local_600 = (pointer)CONCAT44(local_600._4_4_,iVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4e0,"layout(location = ",0x12);
        poVar10 = (ostream *)std::ostream::operator<<(local_4e0,(int)local_608);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") flat in ",10);
        if (DVar7 == DVar5) {
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_618 +
                            (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                    *)(local_4e0._0_8_ + -0x18))->
                                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x138);
          }
          else {
            sVar9 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar11,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          lVar15 = 2;
          pcVar8 = ";\n";
        }
        else {
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_618 +
                            (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                    *)(local_4e0._0_8_ + -0x18))->
                                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x138);
          }
          else {
            sVar9 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar11,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0," v_",3);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)auStack_618 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2f8);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar8,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(v_",3);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)((long)pVVar16 + lVar20 + -8),
                               *(long *)((long)&(pVVar16->type).m_type + lVar20));
          lVar15 = 3;
          pcVar8 = ");\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,lVar15);
        local_608 = (ulong)(uint)((int)local_608 + (int)local_600);
        pSVar13 = (ShaderCaseSpecification *)((long)&local_5f8->caseType + 1);
        pVVar16 = (local_610->m_spec).values.inputs.
                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x50;
      } while (pSVar13 < (ShaderCaseSpecification *)
                         (((long)(local_610->m_spec).values.inputs.
                                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >> 4) *
                         -0x3333333333333333));
    }
    pVVar1 = local_5f0;
    declareUniforms((ostringstream *)local_4e0,local_5f0);
    declareReferenceBlock((ostringstream *)local_4e0,pVVar1);
    pVVar16 = (local_610->m_spec).values.outputs.
              super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((local_610->m_spec).values.outputs.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar16) {
      lVar20 = 0x20;
      uVar17 = 0;
      do {
        pcVar8 = glu::getDataTypeName(*(DataType *)((long)pVVar16 + lVar20 + -0x18));
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)auStack_618 +
                          (int)(((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                  *)(local_4e0._0_8_ + -0x18))->
                               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                               )._M_impl.super__Vector_impl_data._M_start + 0x138);
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0,pcVar8,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e0," ",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4e0,*(char **)((long)pVVar16 + lVar20 + -8),
                             *(long *)((long)&(pVVar16->type).m_type + lVar20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        uVar17 = uVar17 + 1;
        pVVar16 = (local_610->m_spec).values.outputs.
                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x50;
      } while (uVar17 < (ulong)(((long)(local_610->m_spec).values.outputs.
                                       super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >>
                                4) * -0x3333333333333333));
    }
    local_538._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_538._M_impl.super__Rb_tree_header._M_header;
    local_538._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_538._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_538._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_538._M_impl.super__Rb_tree_header._M_header._M_right =
         local_538._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_5e8,(char (*) [13])0xac45be,&local_5a8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_538,&local_5e8);
    paVar2 = &local_5e8.second.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_5e8.second._M_dataplus._M_p,
                      local_5e8.second.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_5e8.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    paVar4 = &local_5a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != paVar4) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_5e8,(char (*) [6])0xac4407,&local_5a8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_538,&local_5e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_5e8.second._M_dataplus._M_p,
                      local_5e8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != paVar4) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_5e8,(char (*) [7])0xb87dd3,&local_5a8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_538,&local_5e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_5e8.second._M_dataplus._M_p,
                      local_5e8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != paVar4) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[20],_const_char_(&)[15],_true>
              (&local_5e8,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [15])"dEQP_FragColor");
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_538,&local_5e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_5e8.second._M_dataplus._M_p,
                      local_5e8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_5e8.first._M_dataplus._M_p,
                      local_5e8.first.field_2._M_allocated_capacity + 1);
    }
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_5e8,(string *)local_558);
    tcu::StringTemplate::specialize
              (&local_5a8,(StringTemplate *)&local_5e8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_538);
    glu::sl::injectExtensionRequirements
              (&local_360,&local_5a8,
               &((local_610->m_spec).programs.
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions,SHADERTYPE_FRAGMENT)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != paVar4) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_5e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_538);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
    std::ios_base::~ios_base((ios_base *)(local_4d0 + 0x60));
    local_580._0_4_ = 1;
    local_580._8_8_ = local_570._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_580 + 8),local_360._M_dataplus._M_p,
               local_360._M_dataplus._M_p + local_360._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)local_588->sources +
                   (uint)local_580._0_4_),(value_type *)(local_580 + 8));
    if ((char *)local_580._8_8_ != local_570._M_local_buf + 8) {
      operator_delete((void *)local_580._8_8_,local_570._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
    local_5a8.field_2._M_allocated_capacity = local_330[0];
    local_5a8._M_dataplus._M_p = (pointer)local_340;
    if (local_340 == local_330) goto LAB_003aa7f6;
  }
  operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
LAB_003aa7f6:
  if (local_550.super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_550.super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar20 = 0;
    uVar17 = 0;
    do {
      lVar15 = 0;
      uVar21 = 0;
      do {
        progNdx = *(size_t *)
                   ((long)&(((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                            (local_550.
                             super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                             ._M_impl.super__Vector_impl_data._M_start)->sources)->
                           super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar15 + lVar20);
        if (progNdx !=
            *(size_t *)
             ((long)&(((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                      (local_550.
                       super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                       ._M_impl.super__Vector_impl_data._M_start)->sources)->
                     super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
                     super__Vector_impl_data._M_finish + lVar15 + lVar20)) {
          vkt::(anonymous_namespace)::getShaderName_abi_cxx11_
                    ((string *)local_4e0,(_anonymous_namespace_ *)(uVar21 & 0xffffffff),
                     (ShaderType)uVar17,progNdx);
          pPVar12 = ::vk::ProgramCollection<glu::ProgramSources>::add
                              (&local_368->glslSources,(string *)local_4e0);
          if ((ShaderCaseSpecification *)local_4e0._0_8_ != (ShaderCaseSpecification *)local_4d0) {
            operator_delete((void *)local_4e0._0_8_,(ulong)(local_4d0._0_8_ + 1));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&pPVar12->sources[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar15),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&(((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                  (local_550.
                                   super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->sources)->
                                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar15 + lVar20));
        }
        uVar21 = uVar21 + 1;
        lVar15 = lVar15 + 0x18;
      } while (uVar21 != 6);
      uVar17 = uVar17 + 1;
      lVar20 = lVar20 + 0xd0;
    } while (uVar17 < (ulong)(((long)local_550.
                                     super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_550.
                                     super__Vector_base<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             0x4ec4ec4ec4ec4ec5));
  }
  std::vector<glu::ProgramSources,_std::allocator<glu::ProgramSources>_>::~vector(&local_550);
  return;
}

Assistant:

void ShaderCase::initPrograms (SourceCollections& sourceCollection) const
{
	vector<ProgramSources>	specializedSources	(m_spec.programs.size());

	DE_ASSERT(isValid(m_spec));

	if (m_spec.expectResult != glu::sl::EXPECT_PASS)
		TCU_THROW(InternalError, "Only EXPECT_PASS is supported");

	if (m_spec.caseType == glu::sl::CASETYPE_VERTEX_ONLY)
	{
		DE_ASSERT(m_spec.programs.size() == 1 && m_spec.programs[0].sources.sources[glu::SHADERTYPE_VERTEX].size() == 1);
		specializedSources[0] << glu::VertexSource(specializeVertexShader(m_spec, m_spec.programs[0].sources.sources[glu::SHADERTYPE_VERTEX][0]))
							  << glu::FragmentSource(genFragmentShader(m_spec));
	}
	else if (m_spec.caseType == glu::sl::CASETYPE_FRAGMENT_ONLY)
	{
		DE_ASSERT(m_spec.programs.size() == 1 && m_spec.programs[0].sources.sources[glu::SHADERTYPE_FRAGMENT].size() == 1);
		specializedSources[0] << glu::VertexSource(genVertexShader(m_spec))
							  << glu::FragmentSource(specializeFragmentShader(m_spec, m_spec.programs[0].sources.sources[glu::SHADERTYPE_FRAGMENT][0]));
	}
	else
	{
		DE_ASSERT(m_spec.caseType == glu::sl::CASETYPE_COMPLETE);

		const int	maxPatchVertices	= 4; // \todo [2015-08-05 pyry] Query

		for (size_t progNdx = 0; progNdx < m_spec.programs.size(); progNdx++)
		{
			const ProgramSpecializationParams	progSpecParams	(m_spec, m_spec.programs[progNdx].requiredExtensions, maxPatchVertices);

			specializeProgramSources(specializedSources[progNdx], m_spec.programs[progNdx].sources, progSpecParams);
		}
	}

	for (size_t progNdx = 0; progNdx < specializedSources.size(); progNdx++)
	{
		for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
		{
			if (!specializedSources[progNdx].sources[shaderType].empty())
			{
				glu::ProgramSources& curSrc	= sourceCollection.glslSources.add(getShaderName((glu::ShaderType)shaderType, progNdx));
				curSrc.sources[shaderType] = specializedSources[progNdx].sources[shaderType];
			}
		}
	}
}